

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesXPath::parseExpression
          (XercesXPath *this,XMLStringPool *stringPool,XercesNamespaceResolver *scopeContext)

{
  ulong getAt;
  short *psVar1;
  uint uVar2;
  MemoryManager *pMVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  XMLSize_t index;
  undefined4 extraout_var;
  BaseRefVectorOf<xercesc_4_0::XercesStep> *this_00;
  undefined4 extraout_var_00;
  long lVar9;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *pRVar10;
  undefined4 extraout_var_01;
  int *piVar11;
  undefined4 extraout_var_02;
  uint *puVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XercesStep *pXVar13;
  XercesNodeTest *pXVar14;
  XercesLocationPath *pXVar15;
  XercesLocationPath *pXVar16;
  XPathException *pXVar17;
  XMLSize_t XVar18;
  BaseRefVectorOf<xercesc_4_0::XercesLocationPath> *pBVar19;
  XMLSize_t XVar20;
  XMLCh *pXVar21;
  ValueVectorOf<int> tokens;
  QName aQName;
  XPathScannerForSchema scanner;
  ValueVectorOf<int> local_130;
  ulong local_108;
  XMLSize_t local_100;
  XMLSize_t local_f8;
  _func_int **local_f0;
  _func_int **local_e8;
  QName local_e0;
  XPathScanner local_98;
  
  if (this->fExpression != (XMLCh *)0x0) {
    lVar9 = 0;
    do {
      psVar1 = (short *)((long)this->fExpression + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    XVar18 = (lVar9 >> 1) - 1;
    if (XVar18 != 0) {
      local_130.fMemoryManager = this->fMemoryManager;
      local_130.fCallDestructor = false;
      local_130.fCurCount = 0;
      local_130.fMaxCount = 0x10;
      local_130.fElemList = (int *)0x0;
      iVar6 = (*(local_130.fMemoryManager)->_vptr_MemoryManager[3])(local_130.fMemoryManager,0x40);
      local_130.fElemList = (int *)CONCAT44(extraout_var,iVar6);
      local_130.fElemList[0] = 0;
      local_130.fElemList[1] = 0;
      local_130.fElemList[2] = 0;
      local_130.fElemList[3] = 0;
      local_130.fElemList[4] = 0;
      local_130.fElemList[5] = 0;
      local_130.fElemList[6] = 0;
      local_130.fElemList[7] = 0;
      local_130.fElemList[8] = 0;
      local_130.fElemList[9] = 0;
      local_130.fElemList[10] = 0;
      local_130.fElemList[0xb] = 0;
      local_130.fElemList[0xc] = 0;
      local_130.fElemList[0xd] = 0;
      local_130.fElemList[0xe] = 0;
      local_130.fElemList[0xf] = 0;
      XPathScannerForSchema::XPathScannerForSchema((XPathScannerForSchema *)&local_98,stringPool);
      bVar5 = XPathScanner::scanExpression(&local_98,this->fExpression,0,XVar18,&local_130);
      XVar18 = local_130.fCurCount;
      if (!bVar5) {
        pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar17,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x18a,XPath_TokenNotSupported,this->fMemoryManager);
        __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
      }
      this_00 = (BaseRefVectorOf<xercesc_4_0::XercesStep> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar3 = this->fMemoryManager;
      local_e8 = (_func_int **)&PTR__BaseRefVectorOf_00409ef0;
      this_00->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409ef0;
      this_00->fAdoptedElems = true;
      this_00->fCurCount = 0;
      this_00->fMaxCount = 0x10;
      this_00->fElemList = (XercesStep **)0x0;
      this_00->fMemoryManager = pMVar3;
      iVar6 = (*pMVar3->_vptr_MemoryManager[3])();
      this_00->fElemList = (XercesStep **)CONCAT44(extraout_var_00,iVar6);
      lVar9 = 0;
      do {
        this_00->fElemList[lVar9] = (XercesStep *)0x0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      local_f0 = (_func_int **)&PTR__RefVectorOf_00409e78;
      this_00->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409e78;
      if (XVar18 != 0) {
        pRVar10 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)
                  XMemory::operator_new(0x30,this->fMemoryManager);
        pMVar3 = this->fMemoryManager;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>)._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__BaseRefVectorOf_00409e30;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fAdoptedElems = true;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fCurCount = 0;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fMaxCount = 8;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fElemList =
             (XercesLocationPath **)0x0;
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fMemoryManager = pMVar3;
        iVar6 = (*pMVar3->_vptr_MemoryManager[3])();
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fElemList =
             (XercesLocationPath **)CONCAT44(extraout_var_01,iVar6);
        lVar9 = 0;
        do {
          (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fElemList[lVar9] =
               (XercesLocationPath *)0x0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        (pRVar10->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>)._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__RefVectorOf_00409db8;
        this->fLocationPaths = pRVar10;
        if (XVar18 != 0) {
          local_f8 = XVar18 - 1;
          local_108 = XVar18;
          local_100 = XVar18 - 2;
          bVar5 = true;
          XVar18 = 0;
          do {
            piVar11 = ValueVectorOf<int>::elementAt(&local_130,XVar18);
            iVar6 = *piVar11;
            bVar4 = false;
            XVar20 = XVar18;
            switch(iVar6) {
            case 4:
              pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesNodeTest::XercesNodeTest(pXVar14,3,this->fMemoryManager);
              pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesStep::XercesStep(pXVar13,3,pXVar14);
              BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
              XVar20 = this_00->fCurCount;
              this_00->fElemList[XVar20] = pXVar13;
              this_00->fCurCount = XVar20 + 1;
              if ((bVar5) && (getAt = XVar18 + 1, getAt < local_108)) {
                piVar11 = ValueVectorOf<int>::elementAt(&local_130,getAt);
                if (*piVar11 != 0x16) {
                  bVar5 = false;
                  goto LAB_0030f3ac;
                }
                if (XVar18 == local_100) {
                  pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                  XPathException::XPathException
                            (pXVar17,
                             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                             ,0x25e,XPath_ExpectedStep2,this->fMemoryManager);
LAB_0030f946:
                  __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
                }
                if ((XVar18 + 2 < local_108) &&
                   (piVar11 = ValueVectorOf<int>::elementAt(&local_130,XVar18 + 2), *piVar11 == 0x15
                   )) {
                  pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                  XPathException::XPathException
                            (pXVar17,
                             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                             ,0x266,XPath_NoForwardSlash,this->fMemoryManager);
                  goto LAB_0030f946;
                }
                pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesNodeTest::XercesNodeTest(pXVar14,3,this->fMemoryManager);
                pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesStep::XercesStep(pXVar13,4,pXVar14);
                BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
                XVar18 = this_00->fCurCount;
                this_00->fElemList[XVar18] = pXVar13;
                this_00->fCurCount = XVar18 + 1;
                XVar18 = getAt;
              }
              goto LAB_0030f3a4;
            case 5:
            case 7:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
              break;
            case 6:
switchD_0030eb8a_caseD_6:
              if (XVar20 == local_f8) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x1c9,XPath_MissingAttr,this->fMemoryManager);
                goto LAB_0030f890;
              }
              XVar18 = XVar20 + 1;
              piVar11 = ValueVectorOf<int>::elementAt(&local_130,XVar18);
              iVar6 = *piVar11;
              if (iVar6 == 9) {
                pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesNodeTest::XercesNodeTest(pXVar14,2,this->fMemoryManager);
                pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesStep::XercesStep(pXVar13,2,pXVar14);
                BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
                goto LAB_0030f035;
              }
              if (iVar6 == 10) {
                bVar5 = true;
              }
              else {
                if (iVar6 != 0xb) {
                  pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                  XPathException::XPathException
                            (pXVar17,
                             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                             ,0x1d1,XPath_ExpectedToken1,this->fMemoryManager);
                  goto LAB_0030f890;
                }
                bVar5 = false;
              }
              XVar18 = XVar20 + 2;
              puVar12 = (uint *)ValueVectorOf<int>::elementAt(&local_130,XVar18);
              uVar2 = *puVar12;
              uVar8 = this->fEmptyNamespaceId;
              uVar7 = uVar8;
              if (scopeContext == (XercesNamespaceResolver *)0x0) {
                pXVar21 = L"";
              }
              else {
                pXVar21 = L"";
                if (uVar2 != 0xffffffff) {
                  iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                                    (stringPool,(ulong)uVar2);
                  pXVar21 = (XMLCh *)CONCAT44(extraout_var_03,iVar6);
                  uVar7 = (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXVar21);
                  uVar8 = this->fEmptyNamespaceId;
                }
              }
              if (((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar2 != 0xffffffff)) &&
                 (uVar7 == uVar8)) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x1f1,XPath_PrefixNoURI,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                           this->fMemoryManager);
                __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
              }
              if (!bVar5) {
                puVar12 = (uint *)ValueVectorOf<int>::elementAt(&local_130,XVar20 + 3);
                iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                                  (stringPool,(ulong)*puVar12);
                QName::QName(&local_e0,pXVar21,(XMLCh *)CONCAT44(extraout_var_06,iVar6),uVar7,
                             this->fMemoryManager);
                pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesNodeTest::XercesNodeTest(pXVar14,&local_e0);
                pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesStep::XercesStep(pXVar13,2,pXVar14);
                BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
                XVar18 = this_00->fCurCount;
                this_00->fElemList[XVar18] = pXVar13;
                this_00->fCurCount = XVar18 + 1;
                QName::~QName(&local_e0);
                XVar18 = XVar20 + 3;
                goto LAB_0030f3a4;
              }
              pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesNodeTest::XercesNodeTest(pXVar14,pXVar21,uVar7,this->fMemoryManager);
              pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesStep::XercesStep(pXVar13,2,pXVar14);
              BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
              XVar20 = this_00->fCurCount;
              this_00->fElemList[XVar20] = pXVar13;
              goto LAB_0030f2d4;
            case 8:
              pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
              XPathException::XPathException
                        (pXVar17,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                         ,0x210,XPath_NoDoubleColon,this->fMemoryManager);
              goto LAB_0030f890;
            case 9:
              pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesNodeTest::XercesNodeTest(pXVar14,2,this->fMemoryManager);
              pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesStep::XercesStep(pXVar13,1,pXVar14);
              BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
LAB_0030f035:
              XVar20 = this_00->fCurCount;
              this_00->fElemList[XVar20] = pXVar13;
LAB_0030f2d4:
              this_00->fCurCount = XVar20 + 1;
LAB_0030f3a4:
              bVar5 = false;
              goto LAB_0030f3ac;
            case 10:
              bVar4 = true;
            case 0xb:
              puVar12 = (uint *)ValueVectorOf<int>::elementAt(&local_130,XVar18 + 1);
              uVar2 = *puVar12;
              uVar8 = this->fEmptyNamespaceId;
              uVar7 = uVar8;
              if (scopeContext == (XercesNamespaceResolver *)0x0) {
                pXVar21 = L"";
              }
              else {
                pXVar21 = L"";
                if (uVar2 != 0xffffffff) {
                  iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                                    (stringPool,(ulong)uVar2);
                  pXVar21 = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
                  uVar7 = (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXVar21);
                  uVar8 = this->fEmptyNamespaceId;
                }
              }
              if (((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar2 != 0xffffffff)) &&
                 (uVar7 == uVar8)) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x239,XPath_PrefixNoURI,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                           this->fMemoryManager);
                __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
              }
              if (!bVar4) {
                puVar12 = (uint *)ValueVectorOf<int>::elementAt(&local_130,XVar18 + 2);
                iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                                  (stringPool,(ulong)*puVar12);
                QName::QName(&local_e0,pXVar21,(XMLCh *)CONCAT44(extraout_var_04,iVar6),uVar7,
                             this->fMemoryManager);
                pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesNodeTest::XercesNodeTest(pXVar14,&local_e0);
                pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesStep::XercesStep(pXVar13,1,pXVar14);
                BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
                XVar20 = this_00->fCurCount;
                this_00->fElemList[XVar20] = pXVar13;
                this_00->fCurCount = XVar20 + 1;
                QName::~QName(&local_e0);
                XVar18 = XVar18 + 2;
                goto LAB_0030f3a4;
              }
              pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesNodeTest::XercesNodeTest(pXVar14,pXVar21,uVar7,this->fMemoryManager);
              pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
              XercesStep::XercesStep(pXVar13,1,pXVar14);
              BaseRefVectorOf<xercesc_4_0::XercesStep>::ensureExtraCapacity(this_00,1);
              XVar20 = this_00->fCurCount;
              this_00->fElemList[XVar20] = pXVar13;
              this_00->fCurCount = XVar20 + 1;
              XVar18 = XVar18 + 1;
              goto LAB_0030f3ac;
            case 0x15:
              if (XVar18 == 0) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x279,XPath_NoForwardSlashAtStart,this->fMemoryManager);
                goto LAB_0030f890;
              }
              if (bVar5) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x27e,XPath_NoSelectionOfRoot,this->fMemoryManager);
                goto LAB_0030f890;
              }
              if (XVar18 == local_f8) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x282,XPath_ExpectedStep3,this->fMemoryManager);
                goto LAB_0030f890;
              }
              piVar11 = ValueVectorOf<int>::elementAt(&local_130,XVar18 + 1);
              if (*piVar11 - 0x15U < 3) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x287,XPath_ExpectedStep3,this->fMemoryManager);
                goto LAB_0030f890;
              }
              break;
            case 0x16:
              pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
              XPathException::XPathException
                        (pXVar17,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                         ,0x274,XPath_NoDoubleForwardSlash,this->fMemoryManager);
LAB_0030f890:
              __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
            case 0x17:
              if (XVar18 == 0) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x19e,XPath_NoUnionAtStart,this->fMemoryManager);
                goto LAB_0030f890;
              }
              if (this_00->fCurCount == 0) {
                pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                XPathException::XPathException
                          (pXVar17,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                           ,0x1a4,XPath_NoMultipleUnion,this->fMemoryManager);
                __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
              }
              pXVar13 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(this_00,0);
              if (pXVar13->fAxisType != 3) {
                pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesNodeTest::XercesNodeTest(pXVar14,3,this->fMemoryManager);
                pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
                XercesStep::XercesStep(pXVar13,3,pXVar14);
                BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt(this_00,pXVar13,0);
              }
              pXVar15 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
              XercesLocationPath::XercesLocationPath
                        (pXVar15,(RefVectorOf<xercesc_4_0::XercesStep> *)this_00);
              pBVar19 = &this->fLocationPaths->
                         super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
              if (pBVar19->fCurCount != 0) {
                XVar20 = 0;
                do {
                  pXVar16 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                                      (pBVar19,XVar20);
                  bVar5 = XercesLocationPath::operator==(pXVar16,pXVar15);
                  if (bVar5) {
                    (*(pXVar15->super_XSerializable)._vptr_XSerializable[1])(pXVar15);
                    goto LAB_0030f1bf;
                  }
                  XVar20 = XVar20 + 1;
                  pBVar19 = &this->fLocationPaths->
                             super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
                } while (XVar20 < pBVar19->fCurCount);
              }
              BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::ensureExtraCapacity(pBVar19,1);
              XVar20 = pBVar19->fCurCount;
              pBVar19->fElemList[XVar20] = pXVar15;
              pBVar19->fCurCount = XVar20 + 1;
LAB_0030f1bf:
              this_00 = (BaseRefVectorOf<xercesc_4_0::XercesStep> *)
                        XMemory::operator_new(0x30,this->fMemoryManager);
              pMVar3 = this->fMemoryManager;
              this_00->_vptr_BaseRefVectorOf = local_e8;
              this_00->fAdoptedElems = true;
              this_00->fCurCount = 0;
              this_00->fMaxCount = 0x10;
              this_00->fElemList = (XercesStep **)0x0;
              this_00->fMemoryManager = pMVar3;
              iVar6 = (*pMVar3->_vptr_MemoryManager[3])();
              this_00->fElemList = (XercesStep **)CONCAT44(extraout_var_05,iVar6);
              lVar9 = 0;
              do {
                this_00->fElemList[lVar9] = (XercesStep *)0x0;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x10);
              this_00->_vptr_BaseRefVectorOf = local_f0;
              bVar5 = true;
              goto LAB_0030f3ac;
            default:
              if (iVar6 == 0x23) {
                XVar20 = XVar18 + 1;
                goto switchD_0030eb8a_caseD_6;
              }
              if (iVar6 == 0x24) {
                if (XVar18 == local_100) {
                  pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
                  XPathException::XPathException
                            (pXVar17,
                             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                             ,0x218,XPath_ExpectedStep1,this->fMemoryManager);
                  goto LAB_0030f890;
                }
                XVar18 = XVar18 + 1;
              }
            }
            bVar5 = false;
LAB_0030f3ac:
            XVar18 = XVar18 + 1;
          } while (XVar18 < local_108);
        }
      }
      if (this_00->fCurCount == 0) {
        if ((this->fLocationPaths == (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) ||
           ((this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fCurCount
            == 0)) {
          pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x295,XPath_EmptyExpr,this->fMemoryManager);
        }
        else {
          pXVar17 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x298,XPath_NoUnionAtEnd,this->fMemoryManager);
        }
        __cxa_throw(pXVar17,&XPathException::typeinfo,XMLException::~XMLException);
      }
      pXVar13 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(this_00,0);
      if (pXVar13->fAxisType != 3) {
        pXVar14 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar14,3,this->fMemoryManager);
        pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar13,3,pXVar14);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt(this_00,pXVar13,0);
      }
      pXVar15 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
      XercesLocationPath::XercesLocationPath
                (pXVar15,(RefVectorOf<xercesc_4_0::XercesStep> *)this_00);
      pBVar19 = &this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
      if (pBVar19->fCurCount != 0) {
        XVar18 = 0;
        do {
          pXVar16 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt(pBVar19,XVar18);
          bVar5 = XercesLocationPath::operator==(pXVar16,pXVar15);
          if (bVar5) {
            (*(pXVar15->super_XSerializable)._vptr_XSerializable[1])(pXVar15);
            goto LAB_0030f4ca;
          }
          XVar18 = XVar18 + 1;
          pBVar19 = &this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
        } while (XVar18 < pBVar19->fCurCount);
      }
      BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::ensureExtraCapacity(pBVar19,1);
      XVar18 = pBVar19->fCurCount;
      pBVar19->fElemList[XVar18] = pXVar15;
      pBVar19->fCurCount = XVar18 + 1;
LAB_0030f4ca:
      (*(local_130.fMemoryManager)->_vptr_MemoryManager[4])
                (local_130.fMemoryManager,local_130.fElemList);
    }
  }
  return;
}

Assistant:

void XercesXPath::parseExpression(XMLStringPool* const stringPool,
                                  XercesNamespaceResolver* const scopeContext) {

    XMLSize_t length = XMLString::stringLen(fExpression);

    if (!length) {
        return;
    }

    ValueVectorOf<int>                tokens(16, fMemoryManager);
    XPathScannerForSchema             scanner(stringPool);
    if(!scanner.scanExpression(fExpression, 0, length, &tokens))
        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_TokenNotSupported, fMemoryManager);

    bool                              firstTokenOfLocationPath=true;
    XMLSize_t                         tokenCount = tokens.size();
    RefVectorOf<XercesStep>*          stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
    Janitor<RefVectorOf<XercesStep> > janSteps(stepsVector);

    if (tokenCount) {
        fLocationPaths = new (fMemoryManager) RefVectorOf<XercesLocationPath>(8, true, fMemoryManager);
    }

    for (XMLSize_t i = 0; i < tokenCount; i++) {

        int  aToken = tokens.elementAt(i);
        bool isNamespace=false;

        switch (aToken) {
        case  XercesXPath::EXPRTOKEN_OPERATOR_UNION:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtStart, fMemoryManager);
                }

                XMLSize_t stepsSize = stepsVector->size();

                if (stepsSize == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoMultipleUnion, fMemoryManager);
                }

                if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
                {
                    // prepend ./
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                    stepsVector->insertElementAt(step, 0);
                }
                XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
                janSteps.orphan();
                bool bFound=false;
                for(XMLSize_t i=0;i<fLocationPaths->size();i++)
                    if((*(fLocationPaths->elementAt(i)))==(*newPath))
                    {
                        bFound=true;
                        break;
                    }
                if(bFound)
                    delete newPath;
                else
                    fLocationPaths->addElement(newPath);
                stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
                janSteps.reset(stepsVector);
                firstTokenOfLocationPath = true;
            }
            break;
        case XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE:
            {
                // consume "::" token and drop through
                i++;
            }
        case XercesXPath::EXPRTOKEN_ATSIGN:
            {
                // consume QName token
                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_MissingAttr, fMemoryManager);
                }

                aToken = tokens.elementAt(++i);

                if (aToken != XercesXPath::EXPRTOKEN_NAMETEST_QNAME
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_ANY
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE) {
                        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedToken1, fMemoryManager);
                }

                bool isNamespaceAtt=false;

                switch (aToken) {

                case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
                    {
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
                    {
                        isNamespaceAtt = true;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
                    {
                        aToken = tokens.elementAt(++i);

                        const XMLCh* prefix = XMLUni::fgZeroLenString;
                        unsigned int uri = fEmptyNamespaceId;

                        if (scopeContext && aToken != -1) {

                            prefix = stringPool->getValueForId(aToken);
                            uri = scopeContext->getNamespaceForPrefix(prefix);
                        }

                        if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                        }

                        if (isNamespaceAtt) {

                            // build step
                            XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                            XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                            stepsVector->addElement(step);
                            break;
                        }

                        aToken = tokens.elementAt(++i);

                        const XMLCh* localPart = stringPool->getValueForId(aToken);
                        QName aQName(prefix, localPart, uri, fMemoryManager);

                        // build step
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
				}

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_DOUBLE_COLON:
            {
                // should never have a bare double colon
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleColon, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_AXISNAME_CHILD:
            {
                // consume "::" token and drop through
                i++;

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep1, fMemoryManager);
                }

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
            {
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
            {
                isNamespace=true;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
            {
                // consume QName token
                aToken = tokens.elementAt(++i);

                const XMLCh* prefix = XMLUni::fgZeroLenString;
                unsigned int uri = fEmptyNamespaceId;

                if (scopeContext && aToken != -1) {

                    prefix = stringPool->getValueForId(aToken);
                    uri = scopeContext->getNamespaceForPrefix(prefix);
                }

                if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                    ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                }

                if (isNamespace) {

                    // build step
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                    stepsVector->addElement(step);
                    break;
                }

                aToken = tokens.elementAt(++i);
                const XMLCh* localPart = stringPool->getValueForId(aToken);
                QName aQName(prefix, localPart, uri, fMemoryManager);

                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_PERIOD:
            {
                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                stepsVector->addElement(step);

                if (firstTokenOfLocationPath && i+1 < tokenCount) {

                    aToken = tokens.elementAt(i+1);

                    if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH){

                        if (++i == tokenCount - 1) {
                            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep2, fMemoryManager);
                        }

                        if (i+1 < tokenCount)	{

                            aToken = tokens.elementAt(i+1);

                            if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH) {
                                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlash, fMemoryManager);
                            }
                        }
                        // build step
                        nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                        step = new (fMemoryManager) XercesStep(XercesStep::AxisType_DESCENDANT, nodeTest);
                        stepsVector->addElement(step);
                    }
                }
                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH:
            {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleForwardSlash, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_SLASH:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlashAtStart, fMemoryManager);
                }

                // keep on truckin'
                if (firstTokenOfLocationPath) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoSelectionOfRoot, fMemoryManager);
                }

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);
                }

                aToken = tokens.elementAt(i+1);
                if(aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_UNION)
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);

                firstTokenOfLocationPath=false;
                break;
            }
        default:
            firstTokenOfLocationPath=false;
        }
    }

    XMLSize_t stepsSize = stepsVector->size();

    if (stepsSize == 0) {
        if (!fLocationPaths || fLocationPaths->size() == 0) {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_EmptyExpr, fMemoryManager);
        }
        else {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtEnd, fMemoryManager);
        }
    }

    if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
    {
        // prepend ./
        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
        stepsVector->insertElementAt(step, 0);
    }
    XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
    janSteps.orphan();
    bool bFound=false;
    for(XMLSize_t j=0;j<fLocationPaths->size();j++)
        if((*(fLocationPaths->elementAt(j)))==(*newPath))
        {
            bFound=true;
            break;
        }
    if(bFound)
        delete newPath;
    else
        fLocationPaths->addElement(newPath);
}